

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O2

int yaml_emitter_dump_node(yaml_emitter_t *emitter,int index)

{
  uint uVar1;
  yaml_node_type_t yVar2;
  yaml_node_t *pyVar3;
  yaml_tag_directive_t *__s1;
  yaml_char_t *pyVar4;
  yaml_version_directive_t *__s;
  yaml_anchors_t *pyVar5;
  int iVar6;
  int *piVar7;
  yaml_event_t local_98;
  
  pyVar5 = emitter->anchors;
  pyVar3 = (emitter->document->nodes).start;
  iVar6 = index + -1;
  uVar1 = pyVar5[iVar6].anchor;
  __s = (yaml_version_directive_t *)0x0;
  if (uVar1 != 0) {
    __s = (yaml_version_directive_t *)yaml_malloc(0x10);
    if (__s == (yaml_version_directive_t *)0x0) {
      return 0;
    }
    sprintf((char *)__s,"id%03d",(ulong)uVar1);
    pyVar5 = emitter->anchors;
  }
  local_98.data.document_start.version_directive = __s;
  if (pyVar5[iVar6].serialized != 0) {
    local_98.data.scalar.length = 0;
    local_98.data._32_8_ = 0;
    local_98.data.document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    local_98.data.document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    local_98.data._40_8_ = 0;
    local_98.type = YAML_ALIAS_EVENT;
    local_98._4_4_ = 0;
LAB_00105f35:
    local_98.end_mark.column = 0;
    local_98.end_mark.line = 0;
    local_98.end_mark.index = 0;
    local_98.start_mark.column = 0;
    local_98.start_mark.line = 0;
    local_98.start_mark.index = 0;
    iVar6 = yaml_emitter_emit(emitter,&local_98);
    return iVar6;
  }
  pyVar5[iVar6].serialized = 1;
  yVar2 = pyVar3[(long)index + -1].type;
  if (yVar2 == YAML_MAPPING_NODE) {
    pyVar4 = pyVar3[(long)index + -1].tag;
    iVar6 = strcmp((char *)pyVar4,"tag:yaml.org,2002:map");
    local_98.data.scalar.length = 0;
    local_98.data._32_8_ = 0;
    local_98.data._40_8_ = 0;
    local_98.type = YAML_MAPPING_START_EVENT;
    local_98._4_4_ = 0;
    local_98.start_mark.index = 0;
    local_98.start_mark.line = 0;
    local_98.start_mark.column = 0;
    local_98.end_mark.index = 0;
    local_98.end_mark.line = 0;
    local_98.end_mark.column = 0;
    local_98.data.sequence_start.implicit._1_3_ = 0;
    local_98.data.sequence_start.implicit._0_1_ = iVar6 == 0;
    local_98.data.sequence_start.style = pyVar3[(long)index + -1].data.sequence.style;
    local_98.data.document_start.tag_directives.start = (yaml_tag_directive_t *)pyVar4;
    iVar6 = yaml_emitter_emit(emitter,&local_98);
    if (iVar6 == 0) {
      return 0;
    }
    piVar7 = pyVar3[(long)index + -1].data.sequence.items.start;
    while (piVar7 < pyVar3[(long)index + -1].data.sequence.items.top) {
      iVar6 = yaml_emitter_dump_node(emitter,*piVar7);
      if (iVar6 == 0) {
        return 0;
      }
      iVar6 = yaml_emitter_dump_node(emitter,piVar7[1]);
      piVar7 = piVar7 + 2;
      if (iVar6 == 0) {
        return 0;
      }
    }
    local_98.type = YAML_MAPPING_END_EVENT;
    local_98._4_4_ = 0;
  }
  else {
    if (yVar2 != YAML_SEQUENCE_NODE) {
      if (yVar2 != YAML_SCALAR_NODE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                      ,0x121,"int yaml_emitter_dump_node(yaml_emitter_t *, int)");
      }
      __s1 = (yaml_tag_directive_t *)pyVar3[(long)index + -1].tag;
      iVar6 = strcmp((char *)__s1,"tag:yaml.org,2002:str");
      local_98.type = YAML_SCALAR_EVENT;
      local_98._4_4_ = 0;
      local_98.data.document_start.tag_directives.end =
           (yaml_tag_directive_t *)pyVar3[(long)index + -1].data.scalar.value;
      local_98.data.scalar.length = pyVar3[(long)index + -1].data.scalar.length;
      local_98.data.scalar.plain_implicit._1_3_ = 0;
      local_98.data.scalar.plain_implicit._0_1_ = iVar6 == 0;
      local_98.data.scalar.quoted_implicit._0_1_ = iVar6 == 0;
      local_98.data.scalar.quoted_implicit._1_3_ = 0;
      local_98.data._44_4_ = 0;
      local_98.data.scalar.style = pyVar3[(long)index + -1].data.scalar.style;
      local_98.data._8_8_ = __s1;
      goto LAB_00105f35;
    }
    pyVar4 = pyVar3[(long)index + -1].tag;
    iVar6 = strcmp((char *)pyVar4,"tag:yaml.org,2002:seq");
    local_98.data.scalar.length = 0;
    local_98.data._32_8_ = 0;
    local_98.data._40_8_ = 0;
    local_98.type = YAML_SEQUENCE_START_EVENT;
    local_98._4_4_ = 0;
    local_98.start_mark.index = 0;
    local_98.start_mark.line = 0;
    local_98.start_mark.column = 0;
    local_98.end_mark.index = 0;
    local_98.end_mark.line = 0;
    local_98.end_mark.column = 0;
    local_98.data.sequence_start.implicit._1_3_ = 0;
    local_98.data.sequence_start.implicit._0_1_ = iVar6 == 0;
    local_98.data.sequence_start.style = pyVar3[(long)index + -1].data.sequence.style;
    local_98.data.document_start.tag_directives.start = (yaml_tag_directive_t *)pyVar4;
    iVar6 = yaml_emitter_emit(emitter,&local_98);
    if (iVar6 == 0) {
      return 0;
    }
    piVar7 = pyVar3[(long)index + -1].data.sequence.items.start;
    while (piVar7 < pyVar3[(long)index + -1].data.sequence.items.top) {
      iVar6 = yaml_emitter_dump_node(emitter,*piVar7);
      piVar7 = piVar7 + 1;
      if (iVar6 == 0) {
        return 0;
      }
    }
    local_98.type = YAML_SEQUENCE_END_EVENT;
    local_98._4_4_ = 0;
  }
  local_98.data._40_8_ = 0;
  local_98.data._32_8_ = 0;
  local_98.data.scalar.length = 0;
  local_98.data.document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  local_98.data.document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  local_98.data.document_start.version_directive = (yaml_version_directive_t *)0x0;
  local_98.end_mark.line = 0;
  local_98.end_mark.column = 0;
  local_98.start_mark.column = 0;
  local_98.end_mark.index = 0;
  local_98.start_mark.index = 0;
  local_98.start_mark.line = 0;
  iVar6 = yaml_emitter_emit(emitter,&local_98);
  return (uint)(iVar6 != 0);
}

Assistant:

static int
yaml_emitter_dump_node(yaml_emitter_t *emitter, int index)
{
    yaml_node_t *node = emitter->document->nodes.start + index - 1;
    int anchor_id = emitter->anchors[index-1].anchor;
    yaml_char_t *anchor = NULL;

    if (anchor_id) {
        anchor = yaml_emitter_generate_anchor(emitter, anchor_id);
        if (!anchor) return 0;
    }

    if (emitter->anchors[index-1].serialized) {
        return yaml_emitter_dump_alias(emitter, anchor);
    }

    emitter->anchors[index-1].serialized = 1;

    switch (node->type) {
        case YAML_SCALAR_NODE:
            return yaml_emitter_dump_scalar(emitter, node, anchor);
        case YAML_SEQUENCE_NODE:
            return yaml_emitter_dump_sequence(emitter, node, anchor);
        case YAML_MAPPING_NODE:
            return yaml_emitter_dump_mapping(emitter, node, anchor);
        default:
            assert(0);      /* Could not happen. */
            break;
    }

    return 0;       /* Could not happen. */
}